

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

void __thiscall
jess_unicode_case_folding_txt_Test::TestBody(jess_unicode_case_folding_txt_Test *this)

{
  uint *puVar1;
  wchar32 wVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  void *pvVar7;
  bool bVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  pointer pfVar10;
  char cVar11;
  code cVar12;
  int iVar13;
  int iVar14;
  size_t sVar15;
  ostream *poVar16;
  pointer *__ptr;
  ulong uVar17;
  char *pcVar18;
  ulong uVar19;
  pointer pfVar20;
  folding_set *set;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar21;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar;
  vector<folding_info,_std::allocator<folding_info>_> folded_codepoints;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  pointer local_a0;
  char32_t local_98;
  undefined4 uStack_94;
  AssertHelper local_90;
  undefined7 uStack_8f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  undefined1 local_80 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  long local_70 [2];
  AssertHelper local_60 [8];
  vector<folding_info,_std::allocator<folding_info>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  read_CaseFolding_txt
            (&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/data/CaseFolding.txt"
            );
  pfVar10 = local_58.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_b0[0] = local_58.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_58.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_58.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_80,local_b0,"folded_codepoints.empty()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x219,(char *)CONCAT71(local_80._1_7_,local_80[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((long *)CONCAT71(local_80._1_7_,local_80[0]) != local_70) {
      operator_delete((long *)CONCAT71(local_80._1_7_,local_80[0]),local_70[0] + 1);
    }
    if ((long *)CONCAT71(uStack_8f,local_90) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_8f,local_90) + 8))();
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    goto LAB_00206bbb;
  }
  if (local_58.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_58.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pfVar20 = local_58.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_b0._0_4_ = jessilib::fold(pfVar20->in_codepoint);
      testing::internal::CmpHelperEQ<char32_t,unsigned_int>
                ((internal *)local_80,"jessilib::fold(folded_codepoint.in_codepoint)",
                 "folded_codepoint.out_codepoint",(char32_t *)local_b0,&pfVar20->out_codepoint);
      if (local_80[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b0);
        lVar5 = CONCAT44(local_b0._4_4_,local_b0._0_4_);
        lVar3 = *(long *)(lVar5 + 0x10);
        lVar4 = *(long *)(lVar3 + -0x18);
        *(uint *)(lVar5 + 0x28 + lVar4) = *(uint *)(lVar5 + 0x28 + lVar4) & 0xffffffb5 | 8;
        puVar1 = (uint *)(lVar5 + 0x28 + *(long *)(lVar3 + -0x18));
        *puVar1 = *puVar1 | 0x4000;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar5 + 0x10),"lhs: ",5);
        lVar3 = CONCAT44(local_b0._4_4_,local_b0._0_4_);
        *(undefined8 *)(lVar3 + 0x20 + *(long *)(*(long *)(lVar3 + 0x10) + -0x18)) = 4;
        std::ostream::_M_insert<unsigned_long>(lVar3 + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_b0._4_4_,local_b0._0_4_) + 0x10),"; rhs: ",7);
        lVar3 = CONCAT44(local_b0._4_4_,local_b0._0_4_);
        *(undefined8 *)(lVar3 + 0x20 + *(long *)(*(long *)(lVar3 + 0x10) + -0x18)) = 8;
        std::ostream::_M_insert<unsigned_long>(lVar3 + 0x10);
        pcVar18 = "";
        if (local_78._M_head_impl !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar18 = *(char **)local_78._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                   ,0x21d,pcVar18);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_b0._4_4_,local_b0._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_b0._4_4_,local_b0._0_4_) + 8))();
        }
      }
      if (local_78._M_head_impl !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_78,local_78._M_head_impl);
      }
      wVar2 = pfVar20->out_codepoint;
      if (pfVar20->in_codepoint == wVar2) {
        local_b0[0] = 1;
        local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      else {
        iVar13 = jessilib::fold(pfVar20->in_codepoint);
        iVar14 = jessilib::fold(wVar2);
        local_b0[0] = iVar13 == iVar14;
        local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar13 != iVar14) {
          testing::Message::Message((Message *)&local_90);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)local_80,(char *)local_b0,
                     "jessilib::equalsi(folded_codepoint.in_codepoint, folded_codepoint.out_codepoint)"
                     ,"false");
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_98,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                     ,0x21f,(char *)CONCAT71(local_80._1_7_,local_80[0]));
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_90)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
          if ((long *)CONCAT71(local_80._1_7_,local_80[0]) != local_70) {
            operator_delete((long *)CONCAT71(local_80._1_7_,local_80[0]),local_70[0] + 1);
          }
          if ((long *)CONCAT71(uStack_8f,local_90) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(uStack_8f,local_90) + 8))();
          }
        }
      }
      if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a8,local_a8);
      }
      pfVar20 = pfVar20 + 1;
    } while (pfVar20 != pfVar10);
  }
  cVar11 = testing::Test::HasFatalFailure();
  if ((cVar11 != '\0') || (cVar11 = testing::Test::HasNonfatalFailure(), cVar11 != '\0')) {
    folding_sets_from_folding_info
              ((vector<folding_set,_std::allocator<folding_set>_> *)local_b0,&local_58);
    pbVar9 = local_a8;
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(local_b0._4_4_,local_b0._0_4_);
    local_90 = (AssertHelper)(pbVar6 != local_a8);
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (pbVar6 == local_a8) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)local_80,(char *)&local_90,"folding_sets.empty()","true");
      testing::internal::AssertHelper::AssertHelper
                (local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                 ,0x225,(char *)CONCAT71(local_80._1_7_,local_80[0]));
      testing::internal::AssertHelper::operator=(local_60,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(local_60);
      if ((long *)CONCAT71(local_80._1_7_,local_80[0]) != local_70) {
        operator_delete((long *)CONCAT71(local_80._1_7_,local_80[0]),local_70[0] + 1);
      }
      if ((long *)CONCAT44(uStack_94,local_98) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(uStack_94,local_98) + 8))();
      }
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_88,local_88);
      }
      pvVar7 = (void *)CONCAT44(local_b0._4_4_,local_b0._0_4_);
      if (pvVar7 != (void *)0x0) {
        operator_delete(pvVar7,(long)local_a0 - (long)pvVar7);
      }
      goto LAB_00206bbb;
    }
    local_40 = local_a8;
    lVar3 = std::cout;
    local_38 = pbVar6;
    for (pbVar21 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(local_b0._4_4_,local_b0._0_4_); std::cout = lVar3, pbVar21 != pbVar9;
        pbVar21 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((pbVar21->field_2)._M_local_buf + 8)) {
      *(uint *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(lVar3 + -0x18)) =
           *(uint *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(lVar3 + -0x18))
           & 0xffffffb5 | 8;
      *(uint *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(lVar3 + -0x18)) =
           *(uint *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(lVar3 + -0x18))
           | 0x4000;
      lVar3 = *(long *)(lVar3 + -0x18);
      if ((&DAT_0057b5a9)[lVar3] == '\0') {
        cVar12 = (code)std::ios::widen((char)lVar3 + -0x38);
        jessilib::deserialize_object[lVar3] = cVar12;
        (&DAT_0057b5a9)[lVar3] = 1;
      }
      jessilib::deserialize_object[lVar3] = (code)0x30;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{ ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"folding_set::mode_type::",0x18);
      iVar13 = *(int *)&(pbVar21->_M_dataplus)._M_p;
      if (iVar13 == 0) {
        bVar8 = false;
        pcVar18 = "constant";
      }
      else if (iVar13 == 2) {
        bVar8 = false;
        pcVar18 = "single";
      }
      else if (iVar13 == 1) {
        bVar8 = false;
        pcVar18 = "alternating";
      }
      else {
        bVar8 = true;
        pcVar18 = (char *)0x0;
      }
      if (bVar8) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x57b4c8);
      }
      else {
        sVar15 = strlen(pcVar18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar18,sVar15);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 4;
      poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"0x",2);
      *(undefined8 *)(poVar16 + *(long *)(*(long *)poVar16 + -0x18) + 0x10) = 4;
      poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
      *(uint *)(poVar16 + *(long *)(*(long *)poVar16 + -0x18) + 0x18) =
           *(uint *)(poVar16 + *(long *)(*(long *)poVar16 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar16 = std::ostream::_M_insert<long>((long)poVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," },",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      std::ostream::put((char)poVar16);
      std::ostream::flush();
      lVar3 = std::cout;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"folded_codepoints.size(): ",0x1a);
    poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"; folding_sets.size(): ",0x17);
    poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    std::ostream::put((char)poVar16);
    std::ostream::flush();
    pbVar9 = local_38;
    pbVar6 = local_40;
    pvVar7 = (void *)CONCAT44(local_b0._4_4_,local_b0._0_4_);
    if (pvVar7 != (void *)0x0) {
      operator_delete(pvVar7,(long)local_a0 - (long)pvVar7);
    }
    if (pbVar9 == pbVar6) goto LAB_00206bbb;
  }
  local_98 = L'\0';
  do {
    uVar19 = (long)local_58.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_58.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    pfVar10 = local_58.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
              super__Vector_impl_data._M_start;
    while (pfVar20 = pfVar10, 0 < (long)uVar19) {
      uVar17 = uVar19 >> 1;
      uVar19 = ~uVar17 + uVar19;
      pfVar10 = pfVar20 + uVar17 + 1;
      if ((uint)local_98 <= pfVar20[uVar17].in_codepoint) {
        uVar19 = uVar17;
        pfVar10 = pfVar20;
      }
    }
    if ((pfVar20 ==
         local_58.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
         super__Vector_impl_data._M_finish) || ((uint)local_98 < pfVar20->in_codepoint)) {
      local_b0._0_4_ = jessilib::fold(local_98);
      testing::internal::CmpHelperEQ<char32_t,char32_t>
                ((internal *)local_80,"codepoint","jessilib::fold(codepoint)",&local_98,
                 (char32_t *)local_b0);
      if (local_80[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b0);
        pcVar18 = "";
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_78._M_head_impl !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar18 = *(char **)local_78._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                   ,0x238,pcVar18);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_b0._4_4_,local_b0._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_b0._4_4_,local_b0._0_4_) + 8))();
        }
      }
      if (local_78._M_head_impl !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_78,local_78._M_head_impl);
      }
    }
    local_98 = local_98 + L'\x01';
  } while (local_98 != L'𐀀');
  local_98 = L'𐀀';
LAB_00206bbb:
  if (local_58.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<folding_info,_std::allocator<folding_info>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<folding_info,_std::allocator<folding_info>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(jess, unicode_case_folding_txt) {
	auto folded_codepoints = read_CaseFolding_txt();
	ASSERT_FALSE(folded_codepoints.empty());

	// Test that every folded codepoint is equal to its folded equivalent
	for (auto& folded_codepoint : folded_codepoints) {
		EXPECT_EQ(jessilib::fold(folded_codepoint.in_codepoint), folded_codepoint.out_codepoint)
			<< std::hex << std::uppercase << "lhs: " << std::setw(4) << folded_codepoint.in_codepoint << "; rhs: " << std::setw(8) << folded_codepoint.out_codepoint;
		EXPECT_TRUE(jessilib::equalsi(folded_codepoint.in_codepoint, folded_codepoint.out_codepoint));
	}

	// If the above failed, print out what the fold table needs to be replaced with
	if (::testing::Test::HasFailure()) {
		auto folding_sets = folding_sets_from_folding_info(folded_codepoints);
		ASSERT_FALSE(folding_sets.empty());
		for (auto& set : folding_sets) {
			// Generate code in the format: { folding_set::mode_type::constant, 0x1234, 0x2345, 1 },
			std::cout << std::hex << std::uppercase << std::setfill('0') << "{ "
				<< "folding_set::mode_type::" << set.type()
				<< ", "
				<< "0x" << std::setw(4) << set.range_start << ", "
				<< "0x" << std::setw(4) << set.range_end << ", "
				<< std::dec << set.diff
				<< " }," << std::endl;
		}

		std::cout << "folded_codepoints.size(): " << folded_codepoints.size() << "; folding_sets.size(): " << folding_sets.size() << std::endl;
	}

	// Test that every non-folded codepoint in [0, 0xFFFF] is equal to itself; we already tested folded ones above
	for (char32_t codepoint = 0; codepoint != 0x10000; ++codepoint) {
		bool is_folded = std::binary_search(folded_codepoints.begin(), folded_codepoints.end(), codepoint);
		if (!is_folded) {
			EXPECT_EQ(codepoint, jessilib::fold(codepoint));
			EXPECT_TRUE(jessilib::equalsi(codepoint, codepoint));
		}
	}
}